

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_00;
  iterator __position;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  undefined4 uVar9;
  __pointer_type pFVar10;
  char *pcVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  unsigned_long uVar15;
  ulong uVar16;
  PrimRef *pPVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  vuint<4> v0;
  vuint<4> geomID;
  vuint<4> v1;
  vuint<4> v2;
  MutexSys *local_b8;
  undefined8 uStack_b0;
  ulong local_a0;
  MutexSys *local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  __pointer_type local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  ThreadLocal2 *local_68;
  undefined8 uStack_60;
  ulong local_50;
  float local_48 [6];
  
  uVar15 = set->_begin;
  local_a0 = (set->_end - uVar15) + 3;
  local_50 = local_a0 >> 2;
  local_98 = (MutexSys *)(local_50 * 0x50);
  local_80 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_00 = pTVar5->parent;
  if (local_80 != (this_00->alloc)._M_b._M_p) {
    uStack_70 = CONCAT71(uStack_70._1_7_,1);
    local_78 = this_00;
    MutexSys::lock(&this_00->mutex);
    pFVar10 = local_80;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (local_80 == (__pointer_type)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_80->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_80->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_80;
    UNLOCK();
    local_b8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_68 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar10->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar10->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar10->thread_local_allocators,__position,&local_68);
    }
    else {
      *__position._M_current = local_68;
      pppTVar2 = &(pFVar10->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(local_b8);
    }
    if ((char)uStack_70 == '\x01') {
      MutexSys::unlock(&local_78->mutex);
    }
  }
  pTVar5->bytesUsed = (long)&local_98->mutex + pTVar5->bytesUsed;
  sVar13 = pTVar5->cur;
  uVar16 = (ulong)(-(int)sVar13 & 0xf);
  uVar12 = (long)&local_98->mutex + uVar16 + sVar13;
  pTVar5->cur = uVar12;
  if (pTVar5->end < uVar12) {
    pTVar5->cur = sVar13;
    if ((MutexSys *)pTVar5->allocBlockSize < (MutexSys *)((long)local_98 << 2)) {
      pcVar11 = (char *)FastAllocator::malloc(local_80,(size_t)&local_98);
    }
    else {
      local_b8 = (MutexSys *)pTVar5->allocBlockSize;
      pcVar11 = (char *)FastAllocator::malloc(local_80,(size_t)&local_b8);
      pTVar5->ptr = pcVar11;
      sVar13 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar13;
      pTVar5->cur = 0;
      pTVar5->end = (size_t)local_b8;
      pTVar5->cur = (size_t)local_98;
      if (local_b8 < local_98) {
        pTVar5->cur = 0;
        local_b8 = (MutexSys *)pTVar5->allocBlockSize;
        pcVar11 = (char *)FastAllocator::malloc(local_80,(size_t)&local_b8);
        pTVar5->ptr = pcVar11;
        sVar13 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar13;
        pTVar5->cur = 0;
        pTVar5->end = (size_t)local_b8;
        pTVar5->cur = (size_t)local_98;
        if (local_b8 < local_98) {
          pTVar5->cur = 0;
          pcVar11 = (char *)0x0;
          goto LAB_00d078b1;
        }
      }
      pTVar5->bytesWasted = sVar13;
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar16;
    pcVar11 = pTVar5->ptr + (uVar12 - (long)local_98);
  }
LAB_00d078b1:
  if (3 < local_a0) {
    lVar14 = 0;
    do {
      uVar12 = set->_end;
      pSVar6 = ((this->createLeafFunc).bvh)->scene;
      local_b8 = (MutexSys *)0x0;
      uStack_b0 = 0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      local_68 = (ThreadLocal2 *)0x0;
      uStack_60 = 0;
      local_98 = (MutexSys *)0xffffffffffffffff;
      uStack_90 = 0xffffffff;
      uStack_8c = 0xffffffff;
      local_48[0] = -NAN;
      local_48[1] = -NAN;
      local_48[2] = -NAN;
      local_48[3] = -NAN;
      pPVar17 = prims + uVar15;
      lVar18 = 0;
      do {
        if (uVar15 < uVar12) {
          fVar3 = (pPVar17->lower).field_0.m128[3];
          *(float *)((long)&local_98 + lVar18) = fVar3;
          fVar4 = (pPVar17->upper).field_0.m128[3];
          *(float *)((long)local_48 + lVar18) = fVar4;
          pGVar7 = (pSVar6->geometries).items[(uint)fVar3].ptr;
          lVar8 = *(long *)&pGVar7->field_0x58;
          lVar20 = (ulong)(uint)fVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar19 = *(uint *)&pGVar7[1].intersectionFilterN >> 2;
          *(uint *)((long)&local_b8 + lVar18) = *(int *)(lVar8 + lVar20) * uVar19;
          *(uint *)((long)&local_78 + lVar18) = *(int *)(lVar8 + 4 + lVar20) * uVar19;
          *(uint *)((long)&local_68 + lVar18) = uVar19 * *(int *)(lVar8 + 8 + lVar20);
          uVar15 = uVar15 + 1;
        }
        else if (lVar18 != 0) {
          *(undefined4 *)((long)&local_98 + lVar18) = local_98._0_4_;
          *(undefined4 *)((long)local_48 + lVar18) = 0xffffffff;
          uVar9 = local_b8._0_4_;
          *(undefined4 *)((long)&local_b8 + lVar18) = local_b8._0_4_;
          *(undefined4 *)((long)&local_78 + lVar18) = uVar9;
          *(undefined4 *)((long)&local_68 + lVar18) = uVar9;
        }
        if (uVar15 < uVar12) {
          pPVar17 = prims + uVar15;
        }
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      lVar18 = lVar14 * 0x50;
      *(MutexSys **)(pcVar11 + lVar18) = local_b8;
      *(undefined8 *)(pcVar11 + lVar18 + 8) = uStack_b0;
      *(ThreadLocal2 **)(pcVar11 + lVar18 + 0x10) = local_78;
      *(undefined8 *)(pcVar11 + lVar18 + 0x10 + 8) = uStack_70;
      *(ThreadLocal2 **)(pcVar11 + lVar18 + 0x20) = local_68;
      *(undefined8 *)(pcVar11 + lVar18 + 0x20 + 8) = uStack_60;
      *(MutexSys **)(pcVar11 + lVar18 + 0x30) = local_98;
      *(ulong *)(pcVar11 + lVar18 + 0x30 + 8) = CONCAT44(uStack_8c,uStack_90);
      *(ulong *)(pcVar11 + lVar18 + 0x40) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar11 + lVar18 + 0x40 + 8) = CONCAT44(local_48[3],local_48[2]);
      lVar14 = lVar14 + 1;
    } while (lVar14 != local_50 + (local_50 == 0));
  }
  uVar12 = 7;
  if (local_50 < 7) {
    uVar12 = local_50;
  }
  return (NodeRef)(uVar12 | (ulong)pcVar11 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }